

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *
__thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_balance
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *node)

{
  bool bVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *right;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *left;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_local;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
           ::left(node);
  pRVar3 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
           ::right(node);
  left = node;
  if ((pRVar3 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                  *)0x0) &&
     (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(pRVar3), bVar1)) {
    if ((pRVar2 == (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                    *)0x0) ||
       (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                ::isRed(pRVar2), !bVar1)) {
      left = _leftRotate(this,node);
    }
    else {
      _flipColors(this,node);
    }
  }
  if (((pRVar2 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   *)0x0) &&
      (pRVar3 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                ::left(pRVar2),
      pRVar3 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0)) &&
     (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(pRVar2), bVar1)) {
    pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
             ::left(pRVar2);
    bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::isRed(pRVar2);
    if (bVar1) {
      left = _rightRotate(this,left);
      _flipColors(this,left);
    }
  }
  return left;
}

Assistant:

inline
    RBTreeNode<TreeElement<Key, Value>>* RBTree<Key, Value>::_balance(RBTreeNode<TreeElement<Key, Value>> *node){
        auto left = node->left();
        auto right = node->right();
        if (right != nullptr && right->isRed()) {
            if (left != nullptr && left->isRed()) {
                _flipColors(node);
            } else {
                node = _leftRotate(node);
            }
        }
        // if node is a 4-node
        if ((left != nullptr && left->left() != nullptr) && (left->isRed() && left->left()->isRed())) {
            node = _rightRotate(node);
            _flipColors(node);
        }
        return node;
    }